

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

QDir __thiscall QFileInfo::absoluteDir(QFileInfo *this)

{
  QFileInfo *in_RSI;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  absolutePath((QString *)&local_30,in_RSI);
  QDir::QDir((QDir *)this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QSharedDataPointer<QDirPrivate>)(QSharedDataPointer<QDirPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QDir QFileInfo::absoluteDir() const
{
    return QDir(absolutePath());
}